

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

ImfTiledInputFile * ImfOpenTiledInputFile(char *name)

{
  ImfTiledInputFile *pIVar1;
  int unaff_retaddr;
  char *in_stack_00000008;
  TiledRgbaInputFile *in_stack_00000010;
  exception *e;
  
  pIVar1 = (ImfTiledInputFile *)operator_new(0x38);
  Imf_3_2::globalThreadCount();
  Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile(in_stack_00000010,in_stack_00000008,unaff_retaddr)
  ;
  return pIVar1;
}

Assistant:

ImfTiledInputFile*
ImfOpenTiledInputFile (const char name[])
{
    try
    {
        return (ImfTiledInputFile*) new OPENEXR_IMF_INTERNAL_NAMESPACE::
            TiledRgbaInputFile (name);
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}